

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O2

void chunk_list_add(chunk_conflict *c)

{
  uint uVar1;
  
  uVar1 = (uint)chunk_list_max;
  if (chunk_list_max % 10 == 0) {
    chunk_list = (chunk_conflict **)mem_realloc(chunk_list,(ulong)uVar1 * 8 + 0x50);
    uVar1 = (uint)chunk_list_max;
  }
  chunk_list_max = (short)uVar1 + 1;
  chunk_list[uVar1] = c;
  return;
}

Assistant:

void chunk_list_add(struct chunk *c)
{
	int newsize = (chunk_list_max + CHUNK_LIST_INCR) *	sizeof(struct chunk *);

	/* Lengthen the list if necessary */
	if ((chunk_list_max % CHUNK_LIST_INCR) == 0)
		chunk_list = (struct chunk **) mem_realloc(chunk_list, newsize);

	/* Add the new one */
	chunk_list[chunk_list_max++] = c;
}